

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeInsert(Builder *this,Id object,Id composite,Id typeId,uint index)

{
  Block *this_00;
  Id IVar1;
  Instruction *this_01;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *insert;
  uint index_local;
  Id typeId_local;
  Id composite_local;
  Id object_local;
  Builder *this_local;
  
  insert._0_4_ = index;
  insert._4_4_ = typeId;
  index_local = composite;
  typeId_local = object;
  _composite_local = this;
  this_01 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,object));
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_01,IVar1,insert._4_4_,OpCompositeInsert);
  local_28 = this_01;
  Instruction::addIdOperand(this_01,typeId_local);
  Instruction::addIdOperand(local_28,index_local);
  Instruction::addImmediateOperand(local_28,(uint)insert);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  Block::addInstruction(this_00,local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  IVar1 = Instruction::getResultId(local_28);
  return IVar1;
}

Assistant:

Id Builder::createCompositeInsert(Id object, Id composite, Id typeId, unsigned index)
{
    Instruction* insert = new Instruction(getUniqueId(), typeId, OpCompositeInsert);
    insert->addIdOperand(object);
    insert->addIdOperand(composite);
    insert->addImmediateOperand(index);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(insert));

    return insert->getResultId();
}